

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_filter_engine.h
# Opt level: O3

bool __thiscall
BamTools::FilterEngine<BamTools::BamAlignmentChecker>::setProperty<int>
          (FilterEngine<BamTools::BamAlignmentChecker> *this,string *filterName,string *propertyName
          ,int *value,ValueCompareType *type)

{
  size_t *psVar1;
  long *plVar2;
  int iVar3;
  pointer pcVar4;
  pointer pPVar5;
  pointer pPVar6;
  long lVar7;
  long *plVar8;
  iterator iVar9;
  iterator iVar10;
  ImplBase *pIVar11;
  __normal_iterator<BamTools::Property_*,_std::vector<BamTools::Property,_std::allocator<BamTools::Property>_>_>
  _Var12;
  ulong uVar13;
  bool bVar14;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilterValue>_>,_bool>
  pVar15;
  undefined1 local_70 [32];
  bool local_50;
  undefined7 uStack_4f;
  PropertyFilterValue local_40;
  
  iVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilter>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilter>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilter>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilter>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilter>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilter>_>_>
                  *)this,filterName);
  if ((_Rb_tree_header *)iVar9._M_node == &(this->m_filters)._M_t._M_impl.super__Rb_tree_header) {
LAB_0015c3cf:
    bVar14 = false;
  }
  else {
    iVar10 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilterValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilterValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilterValue>_>_>
             ::find(iVar9._M_node + 2,propertyName);
    if (iVar10._M_node == (_Base_ptr)&iVar9._M_node[2]._M_parent) {
      iVar3 = *value;
      pIVar11 = (ImplBase *)operator_new(0x18);
      pIVar11->_vptr_ImplBase = (_func_int **)&PTR__ImplBase_001f0f30;
      *(int *)&pIVar11[1]._vptr_ImplBase = iVar3;
      pIVar11->refs = 2;
      local_40.Type = *type;
      local_40.Value.data = pIVar11;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilterValue>
      ::pair<BamTools::PropertyFilterValue,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilterValue>
                  *)local_70,propertyName,&local_40);
      pVar15 = std::
               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,BamTools::PropertyFilterValue>,std::_Select1st<std::pair<std::__cxx11::string_const,BamTools::PropertyFilterValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,BamTools::PropertyFilterValue>>>
               ::_M_emplace_unique<std::pair<std::__cxx11::string,BamTools::PropertyFilterValue>>
                         ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,BamTools::PropertyFilterValue>,std::_Select1st<std::pair<std::__cxx11::string_const,BamTools::PropertyFilterValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,BamTools::PropertyFilterValue>>>
                           *)(iVar9._M_node + 2),
                          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilterValue>
                           *)local_70);
      plVar8 = (long *)CONCAT71(uStack_4f,local_50);
      if (plVar8 != (long *)0x0) {
        plVar2 = plVar8 + 1;
        *plVar2 = *plVar2 + -1;
        if (*plVar2 == 0) {
          (**(code **)(*plVar8 + 8))();
        }
      }
      if ((ImplBase *)local_70._0_8_ != (ImplBase *)(local_70 + 0x10)) {
        operator_delete((void *)local_70._0_8_);
      }
      if (local_40.Value.data != (ImplBase *)0x0) {
        psVar1 = &(local_40.Value.data)->refs;
        *psVar1 = *psVar1 - 1;
        if (*psVar1 == 0) {
          (*(local_40.Value.data)->_vptr_ImplBase[1])();
        }
      }
      psVar1 = &pIVar11->refs;
      *psVar1 = *psVar1 - 1;
      if (*psVar1 == 0) {
        (*pIVar11->_vptr_ImplBase[1])(pIVar11);
      }
      if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
      goto LAB_0015c3cf;
    }
    else {
      iVar3 = *value;
      local_70._0_8_ = operator_new(0x18);
      ((ImplBase *)local_70._0_8_)->_vptr_ImplBase = (_func_int **)&PTR__ImplBase_001f0f30;
      *(int *)&((ImplBase *)(local_70._0_8_ + 0x10))->_vptr_ImplBase = iVar3;
      ((ImplBase *)local_70._0_8_)->refs = 1;
      Variant::operator=((Variant *)(iVar10._M_node + 2),(Variant *)local_70);
      if ((ImplBase *)local_70._0_8_ != (ImplBase *)0x0) {
        psVar1 = (size_t *)(local_70._0_8_ + 8);
        *psVar1 = *psVar1 - 1;
        if (*psVar1 == 0) {
          (**(code **)(*(long *)local_70._0_8_ + 8))();
        }
      }
      *(ValueCompareType *)&iVar10._M_node[2]._M_parent = *type;
    }
    _Var12 = std::
             __find_if<__gnu_cxx::__normal_iterator<BamTools::Property*,std::vector<BamTools::Property,std::allocator<BamTools::Property>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       ((this->m_properties).
                        super__Vector_base<BamTools::Property,_std::allocator<BamTools::Property>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (this->m_properties).
                        super__Vector_base<BamTools::Property,_std::allocator<BamTools::Property>_>.
                        _M_impl.super__Vector_impl_data._M_finish,propertyName);
    if (_Var12._M_current ==
        (this->m_properties).
        super__Vector_base<BamTools::Property,_std::allocator<BamTools::Property>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pcVar4 = (propertyName->_M_dataplus)._M_p;
      local_70._0_8_ = (ImplBase *)(local_70 + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_70,pcVar4,pcVar4 + propertyName->_M_string_length);
      local_50 = true;
      std::vector<BamTools::Property,_std::allocator<BamTools::Property>_>::
      emplace_back<BamTools::Property>(&this->m_properties,(Property *)local_70);
      if ((ImplBase *)local_70._0_8_ != (ImplBase *)(local_70 + 0x10)) {
        operator_delete((void *)local_70._0_8_);
      }
      pPVar5 = (this->m_properties).
               super__Vector_base<BamTools::Property,_std::allocator<BamTools::Property>_>._M_impl.
               super__Vector_impl_data._M_start;
      pPVar6 = (this->m_properties).
               super__Vector_base<BamTools::Property,_std::allocator<BamTools::Property>_>._M_impl.
               super__Vector_impl_data._M_finish;
      bVar14 = true;
      if (pPVar5 != pPVar6) {
        uVar13 = ((long)pPVar6 - (long)pPVar5 >> 3) * -0x3333333333333333;
        lVar7 = 0x3f;
        if (uVar13 != 0) {
          for (; uVar13 >> lVar7 == 0; lVar7 = lVar7 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<BamTools::Property*,std::vector<BamTools::Property,std::allocator<BamTools::Property>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (pPVar5,pPVar6,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<BamTools::Property*,std::vector<BamTools::Property,std::allocator<BamTools::Property>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (pPVar5,pPVar6);
      }
    }
    else {
      (_Var12._M_current)->IsEnabled = true;
      bVar14 = true;
    }
  }
  return bVar14;
}

Assistant:

bool FilterEngine<FilterChecker>::setProperty(const std::string& filterName,
                                              const std::string& propertyName, const T& value,
                                              const PropertyFilterValue::ValueCompareType& type)
{
    // lookup filter by name, return false if not found
    FilterMap::iterator filterIter = m_filters.find(filterName);
    if (filterIter == m_filters.end()) return false;

    // lookup property for filter, add new PropertyFilterValue if not found, modify if already exists
    PropertyFilter& filter = (*filterIter).second;
    PropertyMap::iterator propertyIter = filter.Properties.find(propertyName);

    bool success;

    // property not found for this filter, create new entry
    if (propertyIter == filter.Properties.end())
        success = (filter.Properties.insert(
                       std::make_pair(propertyName, PropertyFilterValue(value, type))))
                      .second;

    // property already exists, modify
    else {
        PropertyFilterValue& filterValue = (*propertyIter).second;
        filterValue.Value = value;
        filterValue.Type = type;
        success = true;
    }

    // if error so far, return false
    if (!success) return false;

    // --------------------------------------------
    // otherwise, set Property.IsEnabled to true

    // lookup property
    std::vector<Property>::iterator knownPropertyIter =
        std::find(m_properties.begin(), m_properties.end(), propertyName);

    // if not found, create a new (enabled) entry (& re-sort list)
    if (knownPropertyIter == m_properties.end()) {
        m_properties.push_back(Property(propertyName, true));
        std::sort(m_properties.begin(), m_properties.end());
    }

    // property already known, set as enabled
    else
        (*knownPropertyIter).IsEnabled = true;

    // return success
    return true;
}